

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbarinfo_commands.cpp
# Opt level: O2

void __thiscall
CommandWeaponAmmo::Tick
          (CommandWeaponAmmo *this,SBarInfoMainBlock *block,DSBarInfo *statusBar,bool hudChanged)

{
  AWeapon *pAVar1;
  PClassAmmo *pPVar2;
  PClassAmmo *pPVar3;
  PClassAmmo *pPVar4;
  bool truth;
  bool bVar5;
  bool bVar6;
  
  SBarInfoCommandFlowControl::Tick((SBarInfoCommandFlowControl *)this,block,statusBar,hudChanged);
  pAVar1 = ((statusBar->super_DBaseStatusBar).CPlayer)->ReadyWeapon;
  if (pAVar1 != (AWeapon *)0x0) {
    pPVar2 = pAVar1->AmmoType1;
    pPVar3 = pAVar1->AmmoType2;
    pPVar4 = (PClassAmmo *)this->ammo[1];
    if (pPVar4 == (PClassAmmo *)0x0) {
      truth = true;
      if ((pPVar2 == (PClassAmmo *)this->ammo[0] && pPVar2 != (PClassAmmo *)0x0) ||
         (pPVar3 != (PClassAmmo *)0x0 && pPVar3 == (PClassAmmo *)this->ammo[0])) goto LAB_004bb1c7;
    }
    else {
      if ((pPVar2 == (PClassAmmo *)0x0) ||
         ((bVar5 = true, pPVar2 != pPVar4 && (pPVar2 != (PClassAmmo *)this->ammo[0])))) {
        bVar5 = pPVar2 == (PClassAmmo *)0x0;
      }
      if ((pPVar3 == (PClassAmmo *)0x0) ||
         ((bVar6 = true, pPVar3 != pPVar4 && (pPVar3 != (PClassAmmo *)this->ammo[0])))) {
        bVar6 = pPVar3 == (PClassAmmo *)0x0;
      }
      truth = true;
      if (((byte)((this->conditionAnd ^ 1U) & (bVar5 | bVar6)) != 0) ||
         ((this->conditionAnd & bVar5 & bVar6) != 0)) goto LAB_004bb1c7;
    }
  }
  truth = false;
LAB_004bb1c7:
  SBarInfoCommandFlowControl::SetTruth((SBarInfoCommandFlowControl *)this,truth,block,statusBar);
  return;
}

Assistant:

void	Tick(const SBarInfoMainBlock *block, const DSBarInfo *statusBar, bool hudChanged)
		{
			SBarInfoNegatableFlowControl::Tick(block, statusBar, hudChanged);

			if(statusBar->CPlayer->ReadyWeapon != NULL)
			{
				const PClass *AmmoType1 = statusBar->CPlayer->ReadyWeapon->AmmoType1;
				const PClass *AmmoType2 = statusBar->CPlayer->ReadyWeapon->AmmoType2;
				bool usesammo1 = (AmmoType1 != NULL);
				bool usesammo2 = (AmmoType2 != NULL);
				//if(!usesammo1 && !usesammo2) //if the weapon doesn't use ammo don't go though the trouble.
				//{
				//	SetTruth(false, block, statusBar);
				//	return;
				//}
				//Or means only 1 ammo type needs to match and means both need to match.
				if(ammo[1] != NULL)
				{
					bool match1 = ((usesammo1 && (AmmoType1 == ammo[0] || AmmoType1 == ammo[1])) || !usesammo1);
					bool match2 = ((usesammo2 && (AmmoType2 == ammo[0] || AmmoType2 == ammo[1])) || !usesammo2);
					if((!conditionAnd && (match1 || match2)) || (conditionAnd && (match1 && match2)))
					{
						SetTruth(true, block, statusBar);
						return;
					}
				}
				else
				{
					if((usesammo1 && (AmmoType1 == ammo[0])) || (usesammo2 && (AmmoType2 == ammo[0])))
					{
						SetTruth(true, block, statusBar);
						return;
					}
				}
			}
			SetTruth(false, block, statusBar);
		}